

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::extractClassName(string *__return_storage_ptr__,string *classOrQualifiedMethodName)

{
  char *pcVar1;
  string local_60 [32];
  long local_40;
  size_t penultimateColons;
  size_t lastColons;
  undefined1 local_19;
  string *local_18;
  string *classOrQualifiedMethodName_local;
  string *className;
  
  local_19 = 0;
  local_18 = classOrQualifiedMethodName;
  classOrQualifiedMethodName_local = __return_storage_ptr__;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)classOrQualifiedMethodName);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  if (*pcVar1 == '&') {
    penultimateColons = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x261224);
    local_40 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x261224);
    if (local_40 == -1) {
      local_40 = 1;
    }
    std::__cxx11::string::substr((ulong)local_60,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_60);
    std::__cxx11::string::~string(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string extractClassName( const std::string& classOrQualifiedMethodName ) {
        std::string className = classOrQualifiedMethodName;
        if( className[0] == '&' )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }